

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

Object * __thiscall Assimp::FBX::Connection::DestinationObject(Connection *this)

{
  LazyObject *this_00;
  Object *pOVar1;
  
  this_00 = Document::GetObject(this->doc,this->dest);
  if (this_00 != (LazyObject *)0x0) {
    pOVar1 = LazyObject::Get(this_00,false);
    return pOVar1;
  }
  __assert_fail("lazy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.cpp"
                ,0x2c7,"const Object *Assimp::FBX::Connection::DestinationObject() const");
}

Assistant:

const Object* Connection::DestinationObject() const
{
    LazyObject* const lazy = doc.GetObject(dest);
    ai_assert(lazy);
    return lazy->Get();
}